

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.h
# Opt level: O1

void __thiscall
chrono::ChIntegrableIIorder::LoadConstraint_Ct
          (ChIntegrableIIorder *this,ChVectorDynamic<> *Qc,double c)

{
  ChException *this_00;
  string local_40;
  
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "LoadConstraint_Ct() not implemented, implicit integrators cannot be used. ","");
  ChException::ChException(this_00,&local_40);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

virtual void LoadConstraint_Ct(ChVectorDynamic<>& Qc,  ///< result: the Qc residual, Qc += c*Ct
                                   const double c          ///< a scaling factor
                                   ) override {
        throw ChException("LoadConstraint_Ct() not implemented, implicit integrators cannot be used. ");
    }